

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

char * __thiscall
Memory::LargeHeapBucket::PageHeapAlloc
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,size_t size,
          ObjectInfoBits attributes,PageHeapMode mode,bool nothrow)

{
  HeapInfo *pHVar1;
  code *pcVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  HeapAllocator *pHVar7;
  PageHeapData *__s;
  undefined4 *puVar8;
  Recycler *this_00;
  ConfigFlagsTable *pCVar9;
  IdleDecommitPageAllocator *this_01;
  char *pcVar10;
  DWORD local_e0;
  byte local_d9;
  DWORD oldProtect;
  bool decommitGuardPage;
  LargeHeapBlock *heapBlock;
  size_t sizeWithHeader;
  char *guardPageAddress;
  char *headerAddress;
  size_t guardPageCount;
  char *baseAddress;
  Segment *segment;
  IdleDecommitPageAllocator *pageAllocator;
  size_t actualPageCount;
  size_t pageCount;
  undefined8 local_80;
  TrackAllocData local_78;
  PageHeapData *local_50;
  PageHeapData *pageHeapData;
  anon_class_16_2_a17ce691 throwOrReturn;
  bool nothrow_local;
  PageHeapMode mode_local;
  size_t sStack_30;
  ObjectInfoBits attributes_local;
  size_t size_local;
  size_t sizeCat_local;
  Recycler *recycler_local;
  LargeHeapBucket *this_local;
  
  throwOrReturn.recycler._4_1_ = nothrow;
  pageHeapData = (PageHeapData *)((long)&throwOrReturn.recycler + 4);
  throwOrReturn.nothrow = (bool *)&sizeCat_local;
  throwOrReturn.recycler._5_1_ = mode;
  throwOrReturn.recycler._6_2_ = attributes;
  sizeCat_local = (size_t)recycler;
  recycler_local = (Recycler *)this;
  pHVar7 = HeapAllocator::GetNoMemProtectInstance();
  TrackAllocData::CreateTrackAllocData
            (&local_78,(type_info *)&PageHeapData::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
             ,0x7a);
  pHVar7 = HeapAllocator::TrackAllocInfo(pHVar7,&local_78);
  pageCount = (size_t)HeapAllocator::NoThrowAllocZero;
  local_80 = 0;
  __s = (PageHeapData *)new<Memory::HeapAllocator>(0x48,pHVar7,true,0x8e2230);
  memset(__s,0,0x48);
  local_50 = __s;
  if (__s == (PageHeapData *)0x0) {
    this_local = (LargeHeapBucket *)
                 PageHeapAlloc::anon_class_16_2_a17ce691::operator()
                           ((anon_class_16_2_a17ce691 *)&pageHeapData,(char *)0x0);
  }
  else {
    if (size < 8) {
      throwOrReturn.recycler._6_2_ = throwOrReturn.recycler._6_2_ | LeafBit;
    }
    BVar6 = Recycler::VerifyEnabled((Recycler *)sizeCat_local);
    sStack_30 = size;
    if (BVar6 != 0) {
      sStack_30 = sizeCat;
    }
    actualPageCount = LargeHeapBlock::GetPagesNeeded(sStack_30,false);
    if (actualPageCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x8f,"(pageCount != 0)","pageCount != 0");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pageAllocator = (IdleDecommitPageAllocator *)(actualPageCount + 1);
    segment = (Segment *)
              HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
    guardPageCount =
         (size_t)PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 ::Alloc((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                          *)segment,(size_t *)&pageAllocator,
                         (SegmentBase<Memory::VirtualAllocWrapper> **)&baseAddress);
    if ((guardPageCount & 0xfff) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x94,"((size_t)baseAddress%AutoSystemInfo::PageSize == 0)",
                         "(size_t)baseAddress%AutoSystemInfo::PageSize == 0");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if (guardPageCount == 0) {
      pHVar7 = HeapAllocator::GetNoMemProtectInstance();
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::PageHeapData>
                (pHVar7,local_50);
      this_local = (LargeHeapBucket *)
                   PageHeapAlloc::anon_class_16_2_a17ce691::operator()
                             ((anon_class_16_2_a17ce691 *)&pageHeapData,(char *)0x0);
    }
    else {
      headerAddress = (char *)((long)pageAllocator - actualPageCount);
      guardPageAddress = (char *)0x0;
      sizeWithHeader = 0;
      heapBlock = (LargeHeapBlock *)(sStack_30 + 0x20);
      local_50->pageHeapMode = ((this->super_HeapBucket).heapInfo)->pageHeapMode;
      uVar3 = (ushort)heapBlock;
      if (local_50->pageHeapMode == PageHeapModeBlockStart) {
        guardPageAddress = (char *)(guardPageCount + (long)headerAddress * 0x1000);
        sizeWithHeader = guardPageCount;
        local_50->paddingBytes = 0;
        local_50->unusedBytes = 0x1000 - (uVar3 & 0xfff) & 0xfff;
        local_50->objectPageAddr = guardPageAddress;
      }
      else if (local_50->pageHeapMode == PageHeapModeBlockEnd) {
        local_50->unusedBytes = 0x10 - (uVar3 & 0xf) & 0xf;
        local_50->paddingBytes = (0x1000 - local_50->unusedBytes) - (uVar3 & 0xfff) & 0xfff;
        if ((local_50->paddingBytes & 0xf) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                             ,0xae,
                             "(pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0)",
                             "pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        guardPageAddress = (char *)(guardPageCount + (long)(int)(uint)local_50->paddingBytes);
        sizeWithHeader = guardPageCount + actualPageCount * 0x1000;
        local_50->objectPageAddr = (char *)guardPageCount;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0xb7,"(false)","false");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      _oldProtect = LargeHeapBlock::New(guardPageAddress,actualPageCount,(Segment *)baseAddress,1,
                                        this);
      if (_oldProtect == (LargeHeapBlock *)0x0) {
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::SuspendIdleDecommit
                  ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                    *)segment);
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::Release((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *)segment,(void *)guardPageCount,(size_t)pageAllocator,baseAddress);
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::ResumeIdleDecommit
                  ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                    *)segment);
        pHVar7 = HeapAllocator::GetNoMemProtectInstance();
        DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::PageHeapData>
                  (pHVar7,local_50);
        this_local = (LargeHeapBucket *)
                     PageHeapAlloc::anon_class_16_2_a17ce691::operator()
                               ((anon_class_16_2_a17ce691 *)&pageHeapData,(char *)0x0);
      }
      else {
        if (local_50->pageHeapMode == PageHeapModeBlockStart) {
          _oldProtect->addressEnd = (char *)(guardPageCount + (long)pageAllocator * 0x1000);
        }
        else {
          _oldProtect->addressEnd = (char *)(guardPageCount + actualPageCount * 0x1000);
        }
        local_50->actualPageCount = (uint)pageAllocator;
        local_50->guardPageAddress = (char *)sizeWithHeader;
        _oldProtect->heapInfo = (this->super_HeapBucket).heapInfo;
        _oldProtect->pageHeapData = local_50;
        local_d9 = 1;
        this_00 = HeapBucket::GetRecycler(&this->super_HeapBucket);
        pCVar9 = Recycler::GetRecyclerFlagsTable(this_00);
        local_d9 = pCVar9->PageHeapDecommitGuardPage & 1;
        this_01 = HeapBlock::GetPageAllocator
                            (&_oldProtect->super_HeapBlock,(this->super_HeapBucket).heapInfo);
        bVar5 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                ::IsPageReuseDisabled(&this_01->super_PageAllocator);
        bVar4 = (local_d9 & 1) != 0;
        local_d9 = bVar4 || bVar5;
        if (bVar4 || bVar5) {
          BVar6 = VirtualFree((LPVOID)sizeWithHeader,(long)headerAddress << 0xc,0x4000);
          if (BVar6 == 0) {
            Js::Throw::FatalInternalError(-0x7fffbffb);
          }
          local_50->isGuardPageDecommitted = true;
        }
        else {
          BVar6 = VirtualProtect((LPVOID)sizeWithHeader,(long)headerAddress << 0xc,1,&local_e0);
          if (BVar6 == 0) {
            Js::Throw::FatalInternalError(-0x7fffbffb);
          }
          local_50->isGuardPageDecommitted = false;
        }
        pcVar10 = LargeHeapBlock::Alloc(_oldProtect,sStack_30,throwOrReturn.recycler._6_2_);
        local_50->objectAddress = pcVar10;
        if (local_50->objectAddress == (char *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                             ,0xf6,"(pageHeapData->objectAddress != nullptr)",
                             "pageHeapData->objectAddress != nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (local_50->objectAddress == (char *)0x0) {
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::SuspendIdleDecommit
                    ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                      *)segment);
          LargeHeapBlock::ReleasePages(_oldProtect,(Recycler *)sizeCat_local);
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::ResumeIdleDecommit
                    ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                      *)segment);
          LargeHeapBlock::Delete(_oldProtect);
          this_local = (LargeHeapBucket *)
                       PageHeapAlloc::anon_class_16_2_a17ce691::operator()
                                 ((anon_class_16_2_a17ce691 *)&pageHeapData,(char *)0x0);
        }
        else {
          local_50->objectEndAddr = local_50->objectAddress + sStack_30;
          memset(local_50->objectPageAddr,0xf0,(ulong)local_50->paddingBytes);
          memset(local_50->objectAddress + sStack_30,0xf0,(ulong)local_50->unusedBytes);
          bVar4 = HeapBlockMap64::SetHeapBlock
                            ((HeapBlockMap64 *)(sizeCat_local + 0x30),guardPageAddress,
                             actualPageCount,&_oldProtect->super_HeapBlock,LargeBlockType,'\0');
          if (bVar4) {
            LargeHeapBlock::SetNextBlock(_oldProtect,this->largePageHeapBlockList);
            this->largePageHeapBlockList = _oldProtect;
            *(size_t *)(sizeCat_local + 0x15fc0) =
                 actualPageCount + *(long *)(sizeCat_local + 0x15fc0);
            pHVar1 = (this->super_HeapBucket).heapInfo;
            pHVar1->heapBlockCount[0xb] = pHVar1->heapBlockCount[0xb] + 1;
            bVar4 = Recycler::ShouldCapturePageHeapAllocStack((Recycler *)sizeCat_local);
            if (bVar4) {
              LargeHeapBlock::CapturePageHeapAllocStack(_oldProtect);
            }
            this_local = (LargeHeapBucket *)
                         PageHeapAlloc::anon_class_16_2_a17ce691::operator()
                                   ((anon_class_16_2_a17ce691 *)&pageHeapData,
                                    local_50->objectAddress);
          }
          else {
            PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::SuspendIdleDecommit
                      ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                        *)segment);
            LargeHeapBlock::ReleasePages(_oldProtect,(Recycler *)sizeCat_local);
            PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::ResumeIdleDecommit
                      ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                        *)segment);
            LargeHeapBlock::Delete(_oldProtect);
            this_local = (LargeHeapBucket *)
                         PageHeapAlloc::anon_class_16_2_a17ce691::operator()
                                   ((anon_class_16_2_a17ce691 *)&pageHeapData,(char *)0x0);
          }
        }
      }
    }
  }
  return (char *)this_local;
}

Assistant:

char*
LargeHeapBucket::PageHeapAlloc(Recycler * recycler, size_t sizeCat, size_t size, ObjectInfoBits attributes, PageHeapMode mode, bool nothrow)
{
    auto throwOrReturn = [&](char* memBlock) ->char*
    {
        if (memBlock==nullptr && !nothrow)
        {
            recycler->OutOfMemory();
        }
        return memBlock;
    };

    PageHeapData* pageHeapData = NoMemProtectHeapNewNoThrowZ(PageHeapData);
    if (pageHeapData == nullptr)
    {
        return throwOrReturn(nullptr);
    }


    if (size < sizeof(void*))
    {
        attributes = (ObjectInfoBits)(attributes | LeafBit);
    }

#ifdef RECYCLER_MEMORY_VERIFY
    if (recycler->VerifyEnabled())
    {
        // with recycler verify enabled, it uses the unaligned bytes
        size = sizeCat;
    }
#endif

    size_t pageCount = LargeHeapBlock::GetPagesNeeded(size, false);
    Assert(pageCount != 0);
    size_t actualPageCount = pageCount + 1; // 1 for guard page
    auto pageAllocator = heapInfo->GetRecyclerLargeBlockPageAllocator();
    Segment * segment;
    char * baseAddress = pageAllocator->Alloc(&actualPageCount, &segment);
    Assert((size_t)baseAddress%AutoSystemInfo::PageSize == 0);
    if (baseAddress == nullptr)
    {
        NoMemProtectHeapDelete(pageHeapData);
        return throwOrReturn(nullptr);
    }

    size_t guardPageCount = actualPageCount - pageCount; // pageAllocator can return more than asked pages
    char* headerAddress = nullptr;
    char* guardPageAddress = nullptr;
    size_t sizeWithHeader = size + sizeof(LargeObjectHeader);
    pageHeapData->pageHeapMode = heapInfo->pageHeapMode;
    if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart)
    {
        headerAddress = baseAddress + AutoSystemInfo::PageSize * guardPageCount;
        guardPageAddress = baseAddress;

        pageHeapData->paddingBytes = 0;
        pageHeapData->unusedBytes = (AutoSystemInfo::PageSize - (sizeWithHeader%AutoSystemInfo::PageSize)) % AutoSystemInfo::PageSize;

        pageHeapData->objectPageAddr = headerAddress;
    }
    else if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockEnd)
    {
        pageHeapData->unusedBytes = (HeapConstants::ObjectGranularity - (sizeWithHeader%HeapConstants::ObjectGranularity)) % HeapConstants::ObjectGranularity;
        pageHeapData->paddingBytes = (ushort)((AutoSystemInfo::PageSize - pageHeapData->unusedBytes - sizeWithHeader%AutoSystemInfo::PageSize) % AutoSystemInfo::PageSize);
        Assert(pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0);

        headerAddress = baseAddress + pageHeapData->paddingBytes;
        guardPageAddress = baseAddress + pageCount * AutoSystemInfo::PageSize;

        pageHeapData->objectPageAddr = baseAddress;
    }
    else
    {
        AnalysisAssert(false);
    }

    LargeHeapBlock * heapBlock = LargeHeapBlock::New(headerAddress, pageCount, segment, 1, this);
    if (!heapBlock)
    {
        pageAllocator->SuspendIdleDecommit();
        pageAllocator->Release(baseAddress, actualPageCount, segment);
        pageAllocator->ResumeIdleDecommit();
        NoMemProtectHeapDelete(pageHeapData);
        return throwOrReturn(nullptr);
    }


    // adjust the addressEnd
    if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart)
    {
        heapBlock->addressEnd = baseAddress + AutoSystemInfo::PageSize * actualPageCount;
    }
    else
    {
        heapBlock->addressEnd = baseAddress + AutoSystemInfo::PageSize * pageCount;
    }

    pageHeapData->actualPageCount = (uint)actualPageCount;
    pageHeapData->guardPageAddress = guardPageAddress;

    heapBlock->heapInfo = this->heapInfo;
    heapBlock->pageHeapData = pageHeapData;
    
    bool decommitGuardPage = true;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    decommitGuardPage = this->GetRecycler()->GetRecyclerFlagsTable().PageHeapDecommitGuardPage;
#if defined(RECYCLER_NO_PAGE_REUSE)
    decommitGuardPage |= heapBlock->GetPageAllocator(heapInfo)->IsPageReuseDisabled();
#endif
#endif
    if (decommitGuardPage)
    {
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
        if (VirtualFree(guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, MEM_DECOMMIT))
        {
            pageHeapData->isGuardPageDecommitted = true;
        }
        else
        {
            Js::Throw::FatalInternalError();
        }
    }
    else
    {
        DWORD oldProtect;
        if (VirtualProtect(guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, PAGE_NOACCESS, &oldProtect))
        {
            pageHeapData->isGuardPageDecommitted = false;
        }
        else
        {
            Js::Throw::FatalInternalError();
        }        
    }

    pageHeapData->objectAddress = heapBlock->Alloc(size, attributes);
    Assert(pageHeapData->objectAddress != nullptr);
    if (!pageHeapData->objectAddress)
    {
        pageAllocator->SuspendIdleDecommit();
        heapBlock->ReleasePages(recycler);
        pageAllocator->ResumeIdleDecommit();
        LargeHeapBlock::Delete(heapBlock);
        return throwOrReturn(nullptr);
    }

    pageHeapData->objectEndAddr = pageHeapData->objectAddress + size;

    // fill pattern before set pageHeapMode, so background scan stack may verify the pattern
    memset(pageHeapData->objectPageAddr, PageHeapMemFill, pageHeapData->paddingBytes);
    memset(pageHeapData->objectAddress + size, PageHeapMemFill, pageHeapData->unusedBytes);

    if (!recycler->heapBlockMap.SetHeapBlock(headerAddress, pageCount, heapBlock, HeapBlock::HeapBlockType::LargeBlockType, 0))
    {
        pageAllocator->SuspendIdleDecommit();
        heapBlock->ReleasePages(recycler);
        pageAllocator->ResumeIdleDecommit();
        LargeHeapBlock::Delete(heapBlock);
        return throwOrReturn(nullptr);
    }

    heapBlock->SetNextBlock(this->largePageHeapBlockList);
    this->largePageHeapBlockList = heapBlock;

#if ENABLE_PARTIAL_GC
    recycler->autoHeap.uncollectedNewPageCount += pageCount;
#endif

    RECYCLER_SLOW_CHECK(this->heapInfo->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]++);
    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, heapBlock->GetPageCount() * AutoSystemInfo::PageSize);

#ifdef STACK_BACK_TRACE
    if (recycler->ShouldCapturePageHeapAllocStack())
    {
        heapBlock->CapturePageHeapAllocStack();
    }
#endif

    return throwOrReturn(pageHeapData->objectAddress);
}